

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O0

void __thiscall t_rb_generator::generate_service(t_rb_generator *this,t_service *tservice)

{
  _Ios_Openmode _Var1;
  int iVar2;
  ostream *poVar3;
  t_service *ptVar4;
  t_program *ptVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  t_rb_ofstream *ptVar6;
  string *psVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_280;
  string local_268;
  string local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  allocator local_149;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string f_service_name;
  t_service *tservice_local;
  t_rb_generator *this_local;
  
  f_service_name.field_2._8_8_ = tservice;
  std::__cxx11::string::string
            ((string *)&local_98,
             (string *)&(this->super_t_oop_generator).super_t_generator.service_name_);
  t_generator::underscore(&local_78,(t_generator *)this,&local_98);
  std::operator+(&local_58,&this->namespace_dir_,&local_78);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,".rb");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  _Var1 = std::__cxx11::string::c_str();
  std::ofstream::open((char *)&this->f_service_,_Var1);
  rb_autogen_comment_abi_cxx11_(&local_c8,this);
  poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_c8);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  render_require_thrift_abi_cxx11_(&local_e8,this);
  std::operator<<(poVar3,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  ptVar4 = t_service::get_extends((t_service *)f_service_name.field_2._8_8_);
  if (ptVar4 != (t_service *)0x0) {
    if ((this->namespaced_ & 1U) == 0) {
      poVar3 = std::operator<<((ostream *)&this->f_service_,"require \'");
      poVar3 = std::operator<<(poVar3,(string *)&this->require_prefix_);
      ptVar4 = t_service::get_extends((t_service *)f_service_name.field_2._8_8_);
      iVar2 = (*(ptVar4->super_t_type).super_t_doc._vptr_t_doc[3])();
      std::__cxx11::string::string((string *)&local_1d0,(string *)CONCAT44(extraout_var_00,iVar2));
      t_generator::underscore(&local_1b0,(t_generator *)this,&local_1d0);
      poVar3 = std::operator<<(poVar3,(string *)&local_1b0);
      poVar3 = std::operator<<(poVar3,"\'");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
    }
    else {
      poVar3 = std::operator<<((ostream *)&this->f_service_,"require \'");
      ptVar4 = t_service::get_extends((t_service *)f_service_name.field_2._8_8_);
      ptVar5 = t_type::get_program(&ptVar4->super_t_type);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_148,"rb",&local_149);
      t_program::get_namespace(&local_128,ptVar5,&local_148);
      rb_namespace_to_path_prefix(&local_108,this,&local_128);
      poVar3 = std::operator<<(poVar3,(string *)&local_108);
      ptVar4 = t_service::get_extends((t_service *)f_service_name.field_2._8_8_);
      iVar2 = (*(ptVar4->super_t_type).super_t_doc._vptr_t_doc[3])();
      std::__cxx11::string::string((string *)&local_190,(string *)CONCAT44(extraout_var,iVar2));
      t_generator::underscore(&local_170,(t_generator *)this,&local_190);
      poVar3 = std::operator<<(poVar3,(string *)&local_170);
      poVar3 = std::operator<<(poVar3,"\'");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
    }
  }
  poVar3 = std::operator<<((ostream *)&this->f_service_,"require \'");
  poVar3 = std::operator<<(poVar3,(string *)&this->require_prefix_);
  std::__cxx11::string::string
            ((string *)&local_210,
             (string *)&(this->super_t_oop_generator).super_t_generator.program_name_);
  t_generator::underscore(&local_1f0,(t_generator *)this,&local_210);
  poVar3 = std::operator<<(poVar3,(string *)&local_1f0);
  poVar3 = std::operator<<(poVar3,"_types\'");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  ptVar5 = t_type::get_program((t_type *)f_service_name.field_2._8_8_);
  ruby_modules_abi_cxx11_(&local_228,this,ptVar5);
  begin_namespace(this,&this->f_service_,&local_228);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  ptVar6 = t_rb_ofstream::indent(&this->f_service_);
  poVar3 = std::operator<<((ostream *)ptVar6,"module ");
  psVar7 = (string *)(**(code **)(*(long *)f_service_name.field_2._8_8_ + 0x18))();
  std::__cxx11::string::string((string *)&local_268,psVar7);
  t_generator::capitalize(&local_248,(t_generator *)this,&local_268);
  poVar3 = std::operator<<(poVar3,(string *)&local_248);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  t_rb_ofstream::indent_up(&this->f_service_);
  generate_service_client(this,(t_service *)f_service_name.field_2._8_8_);
  generate_service_server(this,(t_service *)f_service_name.field_2._8_8_);
  generate_service_helpers(this,(t_service *)f_service_name.field_2._8_8_);
  t_rb_ofstream::indent_down(&this->f_service_);
  ptVar6 = t_rb_ofstream::indent(&this->f_service_);
  poVar3 = std::operator<<((ostream *)ptVar6,"end");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  ptVar5 = t_type::get_program((t_type *)f_service_name.field_2._8_8_);
  ruby_modules_abi_cxx11_(&local_280,this,ptVar5);
  end_namespace(this,&this->f_service_,&local_280);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_280);
  std::ofstream::close();
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void t_rb_generator::generate_service(t_service* tservice) {
  string f_service_name = namespace_dir_ + underscore(service_name_) + ".rb";
  f_service_.open(f_service_name.c_str());

  f_service_ << rb_autogen_comment() << endl << render_require_thrift();

  if (tservice->get_extends() != nullptr) {
    if (namespaced_) {
      f_service_ << "require '" << rb_namespace_to_path_prefix(
                                       tservice->get_extends()->get_program()->get_namespace("rb"))
                 << underscore(tservice->get_extends()->get_name()) << "'" << endl;
    } else {
      f_service_ << "require '" << require_prefix_
                 << underscore(tservice->get_extends()->get_name()) << "'" << endl;
    }
  }

  f_service_ << "require '" << require_prefix_ << underscore(program_name_) << "_types'" << endl
             << endl;

  begin_namespace(f_service_, ruby_modules(tservice->get_program()));

  f_service_.indent() << "module " << capitalize(tservice->get_name()) << endl;
  f_service_.indent_up();

  // Generate the three main parts of the service (well, two for now in PHP)
  generate_service_client(tservice);
  generate_service_server(tservice);
  generate_service_helpers(tservice);

  f_service_.indent_down();
  f_service_.indent() << "end" << endl << endl;

  end_namespace(f_service_, ruby_modules(tservice->get_program()));

  // Close service file
  f_service_.close();
}